

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::commitTexturePage
          (SparseTextureClampLookupColorTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  GLenum err;
  ostream *poVar1;
  TestError *this_00;
  ulong uVar2;
  int local_60;
  GLint local_5c;
  GLint depth;
  GLint height;
  GLint width;
  int local_44;
  GLuint *pGStack_40;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureClampLookupColorTestCase *this_local;
  
  local_44 = level;
  pGStack_40 = texture;
  texture_local._0_4_ = format;
  texture_local._4_4_ = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  poVar1 = std::operator<<((ostream *)
                           &(this->super_SparseTextureClampLookupResidencyTestCase).
                            super_SparseTexture2LookupTestCase.
                            super_SparseTexture2CommitmentTestCase.
                            super_SparseTextureCommitmentTestCase.field_0x88,
                           "Commit Region [level: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_44);
  std::operator<<(poVar1,"] - ");
  if (local_44 <=
      (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
      super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.levels +
      -1) {
    uVar2 = (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                   super_SparseTexture2LookupTestCase.
                                   super_SparseTexture2CommitmentTestCase.
                                   super_SparseTextureCommitmentTestCase.super_TestCase.
                                   super_TestCase.super_TestNode + 0x68))
                      (this,texture_local._4_4_,local_44);
    if (((uVar2 & 1) == 0) ||
       (uVar2 = (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                       super_SparseTexture2LookupTestCase.
                                       super_SparseTexture2CommitmentTestCase.
                                       super_SparseTextureCommitmentTestCase.super_TestCase.
                                       super_TestCase.super_TestNode + 0x70))
                          (this,texture_local._4_4_,local_44), (uVar2 & 1) == 0)) {
      poVar1 = std::operator<<((ostream *)
                               &(this->super_SparseTextureClampLookupResidencyTestCase).
                                super_SparseTexture2LookupTestCase.
                                super_SparseTexture2CommitmentTestCase.
                                super_SparseTextureCommitmentTestCase.field_0x88,
                               "Skip commitment [level: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_44);
      std::operator<<(poVar1,"] - ");
      this_local._7_1_ = false;
    }
    else {
      SparseTextureUtils::getTextureLevelSize
                (texture_local._4_4_,
                 &(this->super_SparseTextureClampLookupResidencyTestCase).
                  super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                  super_SparseTextureCommitmentTestCase.mState,local_44,&depth,&local_5c,&local_60);
      if (texture_local._4_4_ == 0x8513) {
        local_60 = local_60 * 6;
      }
      gl4cts::Texture::Bind(_format_local,*pGStack_40,texture_local._4_4_);
      (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                             super_SparseTexture2LookupTestCase.
                             super_SparseTexture2CommitmentTestCase.
                             super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                             super_TestNode + 0x28))
                (this,_format_local,texture_local._4_4_,(GLint)texture_local,pGStack_40,local_44,0,0
                 ,0,depth,local_5c,local_60,1);
      err = (*_format_local->getError)();
      glu::checkError(err,"texPageCommitment",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x3f1);
      this_local._7_1_ = true;
    }
    return this_local._7_1_;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
             ,0x3de);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool SparseTextureClampLookupColorTestCase::commitTexturePage(const Functions& gl, GLint target, GLint format,
															  GLuint& texture, GLint level)
{
	mLog << "Commit Region [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	// Avoid not allowed commitments
	if (!isInPageSizesRange(target, level) || !isPageSizesMultiplication(target, level))
	{
		mLog << "Skip commitment [level: " << level << "] - ";
		return false;
	}

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = 6 * depth;

	Texture::Bind(gl, texture, target);
	texPageCommitment(gl, target, format, texture, level, 0, 0, 0, width, height, depth, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texPageCommitment");

	return true;
}